

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::Attribute::set_value<std::vector<float,std::allocator<float>>>
          (Attribute *this,vector<float,_std::allocator<float>_> *v)

{
  long *local_40 [2];
  long local_30 [2];
  
  if ((this->_type_name)._M_string_length == 0) {
    tinyusdz::value::TypeTraits<std::vector<float,std::allocator<float>>>::type_name_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->_type_name,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  linb::any::operator=((any *)&this->_var,v);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }